

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_colorf nk_color_cf(nk_color in)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [13];
  nk_colorf nVar3;
  
  auVar2[0xc] = in.a;
  auVar2._0_12_ = ZEXT712(0);
  nVar3.r = (float)((uint)in & 0xff) * 0.003921569;
  nVar3.g = (float)((uint)in >> 8 & 0xff) * 0.003921569;
  auVar1._4_4_ = (float)(int)CONCAT32(auVar2._10_3_,(ushort)in.b) * 0.003921569;
  auVar1._0_4_ = nVar3.g;
  auVar1._8_4_ = (float)(uint3)(auVar2._10_3_ >> 0x10) * 0.003921569;
  nVar3.b = (float)(int)auVar1._4_8_;
  nVar3.a = (float)(int)((ulong)auVar1._4_8_ >> 0x20);
  return nVar3;
}

Assistant:

NK_API struct nk_colorf
nk_color_cf(struct nk_color in)
{
    struct nk_colorf o;
    nk_color_f(&o.r, &o.g, &o.b, &o.a, in);
    return o;
}